

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas.cpp
# Opt level: O1

CompressionFunction * duckdb::GetPatasFunction<double>(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_PATAS;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = PatasInitAnalyze<double>;
  in_RDI->analyze = PatasAnalyze<double>;
  in_RDI->final_analyze = PatasFinalAnalyze<double>;
  in_RDI->init_compression = PatasInitCompression<double>;
  in_RDI->compress = PatasCompress<double>;
  in_RDI->compress_finalize = PatasFinalizeCompress<double>;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = PatasInitScan<double>;
  in_RDI->scan_vector = PatasScan<double>;
  in_RDI->scan_partial = PatasScanPartial<double>;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = PatasFetchRow<double>;
  in_RDI->skip = PatasSkip<double>;
  in_RDI->init_segment = (compression_init_segment_t)0x0;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&in_RDI->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&in_RDI->get_segment_info + 1) = 0;
  return in_RDI;
}

Assistant:

CompressionFunction GetPatasFunction<double>(PhysicalType data_type) {
	return CompressionFunction(CompressionType::COMPRESSION_PATAS, data_type, PatasInitAnalyze<double>,
	                           PatasAnalyze<double>, PatasFinalAnalyze<double>, PatasInitCompression<double>,
	                           PatasCompress<double>, PatasFinalizeCompress<double>, PatasInitScan<double>,
	                           PatasScan<double>, PatasScanPartial<double>, PatasFetchRow<double>, PatasSkip<double>);
}